

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

char * Fantasy_Character_parse_json_union
                 (flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t type,
                 flatcc_builder_ref_t *result)

{
  byte bVar1;
  ulong uVar2;
  int32_t iVar3;
  int iVar4;
  flatcc_builder_ref_t fVar5;
  size_t n;
  void *struct_base;
  char *pcVar6;
  ulong uVar7;
  ulong *buf_00;
  int *piVar8;
  undefined7 in_register_00000009;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  byte *buf_01;
  ulong *puVar13;
  bool bVar14;
  int more;
  uint64_t value;
  int local_44;
  int32_t local_40;
  int local_3c;
  uint64_t local_38;
  
  *result = 0;
  switch(CONCAT71(in_register_00000009,type) & 0xffffffff) {
  case 0:
    if ((3 < (long)end - (long)buf) && (*(int *)buf == 0x6c6c756e)) {
      return buf + 4;
    }
    iVar4 = 0x1a;
    goto LAB_0011bfc0;
  case 2:
    *result = 0;
    iVar4 = flatcc_builder_start_table(ctx->ctx,1);
    if (iVar4 == 0) {
      if ((buf == end) || (*buf != '{')) {
        local_44 = 0;
        buf = flatcc_json_parser_set_error(ctx,buf,end,0x15);
      }
      else {
        puVar13 = (ulong *)(buf + 1);
        if ((long)end - (long)puVar13 < 2) {
LAB_0011c066:
          puVar13 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)puVar13,end);
        }
        else if ((char)(byte)*puVar13 < '!') {
          if (((byte)*puVar13 != 0x20) || (buf[2] < '!')) goto LAB_0011c066;
          puVar13 = (ulong *)(buf + 2);
        }
        if ((puVar13 == (ulong *)end) || ((byte)*puVar13 != 0x7d)) {
          local_44 = 1;
          buf = (char *)puVar13;
        }
        else {
          local_44 = 0;
          buf = (char *)((long)puVar13 + 1);
          if ((long)end - (long)buf < 2) {
LAB_0011c587:
            buf = flatcc_json_parser_space_ext(ctx,buf,end);
          }
          else if (*buf < '!') {
            if ((*buf != 0x20) || ((char)*(byte *)((long)puVar13 + 2) < '!')) goto LAB_0011c587;
            buf = (char *)((long)puVar13 + 2);
          }
        }
      }
      while (local_44 != 0) {
        if (buf != end) {
          if ((byte)*(ulong *)buf == 0x2e) {
            buf = flatcc_json_parser_set_error(ctx,buf,end,5);
          }
          else if ((byte)*(ulong *)buf == 0x22) {
            buf = (char *)((long)buf + 1);
            ctx->unquoted = 0;
          }
          else {
            ctx->unquoted = 1;
          }
        }
        if ((ulong)((long)end - (long)buf) < 8) {
          uVar7 = 0;
          switch((long)end - (long)buf) {
          case 7:
            uVar7 = (long)(char)*(byte *)((long)buf + 6) << 8;
          case 6:
            uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 5) << 0x10;
          case 5:
            uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 4) << 0x18;
          case 4:
            uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 3) << 0x20;
          case 3:
            uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 2) << 0x28;
          case 2:
            uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 1) << 0x30;
          case 1:
            uVar7 = uVar7 | (ulong)(byte)*(ulong *)buf << 0x38;
          }
        }
        else {
          uVar7 = *(ulong *)buf;
          uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                  (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                  (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38;
        }
        puVar13 = (ulong *)buf;
        if (uVar7 == 0x73776f72645f6174) {
          puVar13 = (ulong *)((long)buf + 8);
          if ((ulong)((long)end - (long)puVar13) < 8) {
            uVar7 = 0;
            switch((long)end - (long)puVar13) {
            case 7:
              uVar7 = (long)(char)*(byte *)((long)buf + 0xe) << 8;
            case 6:
              uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 0xd) << 0x10;
            case 5:
              uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 0xc) << 0x18;
            case 4:
              uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 0xb) << 0x20;
            case 3:
              uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 10) << 0x28;
            case 2:
              uVar7 = uVar7 | (long)(char)*(byte *)((long)buf + 9) << 0x30;
            case 1:
              uVar7 = uVar7 | (ulong)(byte)*puVar13 << 0x38;
            }
          }
          else {
            uVar7 = *puVar13;
            uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                    (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                    (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                    (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
          }
          if (uVar7 != 0x7461636b5f64616d) goto LAB_0011c259;
          puVar13 = (ulong *)((long)buf + 0x10);
          uVar7 = (long)end - (long)puVar13;
          if (uVar7 < 8) {
            uVar12 = 0;
            uVar10 = 0;
            uVar11 = 0;
            uVar9 = 0;
            switch(uVar7) {
            case 7:
            case 6:
            case 5:
            case 4:
              uVar12 = (uint)(char)*(byte *)((long)buf + 0x13);
            case 3:
              uVar10 = uVar12 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x12) << 0x28) >>
                                      0x20);
            case 2:
              uVar11 = uVar10 | (uint)((ulong)((long)(char)*(byte *)((long)buf + 0x11) << 0x30) >>
                                      0x20);
            case 1:
              uVar9 = uVar11 | (uint)(((ulong)(byte)*puVar13 << 0x38) >> 0x20);
            }
          }
          else {
            uVar2 = *puVar13;
            uVar9 = (uint)(uVar2 >> 8) & 0xff00 | (uint)(((uVar2 & 0xff00) << 0x28) >> 0x20) |
                    (uint)((uVar2 << 0x38) >> 0x20);
          }
          if (uVar9 >> 8 == 0x616765) {
            buf_00 = puVar13;
            if (3 < (long)uVar7) {
              bVar1 = *(byte *)((long)buf + 0x13);
              if (ctx->unquoted == 0) {
                if (bVar1 == 0x22) {
                  buf_01 = (byte *)((long)buf + 0x14);
                  goto LAB_0011c36a;
                }
              }
              else if ((char)bVar1 < '!' || bVar1 == 0x3a) {
                buf_01 = (byte *)((long)buf + 0x13);
                ctx->unquoted = 0;
LAB_0011c36a:
                if ((long)end - (long)buf_01 < 2) {
LAB_0011c389:
                  buf_01 = (byte *)flatcc_json_parser_space_ext(ctx,(char *)buf_01,end);
                }
                else if ((char)*buf_01 < '!') {
                  if ((*buf_01 != 0x20) || ((char)buf_01[1] < '!')) goto LAB_0011c389;
                  buf_01 = buf_01 + 1;
                }
                if ((buf_01 == (byte *)end) || (*buf_01 != 0x3a)) {
                  buf_00 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)buf_01,end,4);
                }
                else {
                  buf_00 = (ulong *)(buf_01 + 1);
                  if ((long)end - (long)buf_00 < 2) {
LAB_0011c3e2:
                    buf_00 = (ulong *)flatcc_json_parser_space_ext(ctx,(char *)buf_00,end);
                  }
                  else if ((char)(byte)*buf_00 < '!') {
                    if (((byte)*buf_00 != 0x20) || ((char)buf_01[2] < '!')) goto LAB_0011c3e2;
                    buf_00 = (ulong *)(buf_01 + 2);
                  }
                }
              }
            }
            if (puVar13 == buf_00) {
              buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)buf_00,end);
            }
            else {
              local_40 = 0;
              local_38 = 0;
              local_3c = 0;
              puVar13 = buf_00;
              if ((buf_00 != (ulong *)end) &&
                 (puVar13 = (ulong *)flatcc_json_parser_integer
                                               (ctx,(char *)buf_00,end,&local_3c,&local_38),
                 puVar13 != buf_00)) {
                if (local_3c == 0) {
                  uVar7 = local_38;
                  if (local_38 >> 0x1f == 0) goto LAB_0011c4ab;
                  iVar4 = 7;
                }
                else {
                  if (local_38 < 0x80000001) {
                    uVar7 = -local_38;
LAB_0011c4ab:
                    local_40 = (int32_t)uVar7;
                    goto LAB_0011c4af;
                  }
                  iVar4 = 8;
                }
                puVar13 = (ulong *)flatcc_json_parser_set_error(ctx,(char *)puVar13,end,iVar4);
              }
LAB_0011c4af:
              if ((buf_00 == puVar13) &&
                 (buf = flatcc_json_parser_symbolic_int32
                                  (ctx,(char *)puVar13,end,
                                   (flatcc_json_parser_integral_symbol_f **)
                                   Fantasy_Attacker_parse_json_table_symbolic_parsers,&local_40),
                 bVar14 = (ulong *)buf == puVar13, puVar13 = (ulong *)buf, buf == end || bVar14)) {
                bVar14 = false;
              }
              else {
                iVar3 = local_40;
                buf = (char *)puVar13;
                if ((local_40 != 0) || (bVar14 = true, (ctx->flags & 2) != 0)) {
                  bVar14 = false;
                  piVar8 = (int *)flatcc_builder_table_add(ctx->ctx,0,4,4);
                  if (piVar8 != (int *)0x0) {
                    *piVar8 = iVar3;
                    bVar14 = true;
                  }
                }
              }
              if (!bVar14) goto LAB_0011c547;
            }
          }
          else {
            buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar13,end);
          }
        }
        else {
LAB_0011c259:
          buf = flatcc_json_parser_unmatched_symbol(ctx,(char *)puVar13,end);
        }
        buf = flatcc_json_parser_object_end(ctx,buf,end,&local_44);
      }
      if (ctx->error == 0) {
        fVar5 = flatcc_builder_end_table(ctx->ctx);
        *result = fVar5;
        if (fVar5 != 0) break;
      }
    }
LAB_0011c547:
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 8:
    *result = 0;
    struct_base = flatcc_builder_start_struct(ctx->ctx,8,4);
    if ((struct_base != (void *)0x0) &&
       (buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx,buf,end,struct_base), ctx->error == 0))
    {
      fVar5 = flatcc_builder_end_struct(ctx->ctx);
      *result = fVar5;
      if (fVar5 != 0) break;
    }
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
    break;
  case 9:
  case 10:
    buf = Fantasy_BookReader_parse_json_struct(ctx,buf,end,result);
    break;
  case 0xb:
switchD_0011be98_caseD_b:
    buf = flatcc_json_parser_build_string(ctx,buf,end,result);
    break;
  default:
    if ((int)CONCAT71(in_register_00000009,type) == 0xff) goto switchD_0011be98_caseD_b;
  case 1:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    if ((ctx->flags & 1) != 0) {
      pcVar6 = flatcc_json_parser_generic_json(ctx,buf,end);
      return pcVar6;
    }
    iVar4 = 0xf;
LAB_0011bfc0:
    pcVar6 = flatcc_json_parser_set_error(ctx,buf,end,iVar4);
    return pcVar6;
  }
  if ((ctx->error == 0) && (*result == 0)) {
    buf = flatcc_json_parser_set_error(ctx,buf,end,0x23);
  }
  return (char *)(ulong *)buf;
}

Assistant:

static const char *Fantasy_Character_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)
{

    *result = 0;
    switch (type) {
    case 0: /* NONE */
        return flatcc_json_parser_none(ctx, buf, end);
    case 2: /* MuLan */
        buf = Fantasy_Attacker_parse_json_table(ctx, buf, end, result);
        break;
    case 8: /* Rapunzel */
        buf = Fantasy_Rapunzel_parse_json_struct(ctx, buf, end, result);
        break;
    case 9: /* Belle */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 10: /* BookFan */
        buf = Fantasy_BookReader_parse_json_struct(ctx, buf, end, result);
        break;
    case 11: /* Other */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    case 255: /* Unused */
        buf = flatcc_json_parser_build_string(ctx, buf, end, result);
        break;
    default:
        if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {
            return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);
        } else {
            return flatcc_json_parser_generic_json(ctx, buf, end);
        }
    }
    if (ctx->error) return buf;
    if (!*result) {
        return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
    }
    return buf;
}